

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_float_partial_array(coda_cursor *cursor,long offset,long length,float *dst)

{
  int iVar1;
  char *pcVar2;
  double *pdVar3;
  int64_t *dst_00;
  uint64_t *dst_01;
  long *in_FS_OFFSET;
  float local_8c;
  coda_type *local_80;
  double *array_3;
  uint64_t *array_2;
  int64_t *array_1;
  double *array;
  long num_elements;
  long i;
  coda_type *type;
  coda_conversion *conversion;
  float *pfStack_30;
  coda_native_type read_type;
  float *dst_local;
  long length_local;
  long offset_local;
  coda_cursor *cursor_local;
  
  pfStack_30 = dst;
  dst_local = (float *)length;
  length_local = offset;
  offset_local = (long)cursor;
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x13f1);
    cursor_local._4_4_ = -1;
  }
  else if (dst == (float *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x13f6);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_80 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_80 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    i = (long)local_80;
    if (local_80->type_class == 1) {
      if (*(int *)(*in_FS_OFFSET + -0x1208) != 0) {
        iVar1 = coda_cursor_get_num_elements(cursor,(long *)&array);
        if (iVar1 != 0) {
          return -1;
        }
        if ((length_local < 0) || ((long)array <= length_local)) {
          coda_set_error(-0x6b,"array offset (%ld) exceeds array range [0:%ld)",length_local,array);
          return -1;
        }
        if ((long)array < length_local + (long)dst_local) {
          coda_set_error(-0x6b,"array offset (%ld) + length (%ld) exceeds array range [0:%ld)",
                         length_local,dst_local,array);
          return -1;
        }
      }
      iVar1 = get_array_element_unconverted_read_type
                        ((coda_type *)i,(coda_native_type *)((long)&conversion + 4),
                         (coda_conversion **)&type);
      if (iVar1 == 0) {
        if (type == (coda_type *)0x0) {
          switch(conversion._4_4_) {
          case coda_native_type_int8:
            iVar1 = read_int8_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,
                               (int8_t *)pfStack_30);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)(int)*(char *)((long)pfStack_30 + num_elements);
            }
            break;
          case coda_native_type_uint8:
            iVar1 = read_uint8_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,
                               (uint8_t *)pfStack_30);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)*(byte *)((long)pfStack_30 + num_elements);
            }
            break;
          case coda_native_type_int16:
            iVar1 = read_int16_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,
                               (int16_t *)pfStack_30);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)(int)*(short *)((long)pfStack_30 + num_elements * 2)
              ;
            }
            break;
          case coda_native_type_uint16:
            iVar1 = read_uint16_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,
                               (uint16_t *)pfStack_30);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)*(ushort *)((long)pfStack_30 + num_elements * 2);
            }
            break;
          case coda_native_type_int32:
            iVar1 = read_int32_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,
                               (int32_t *)pfStack_30);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)(int)pfStack_30[num_elements];
            }
            break;
          case coda_native_type_uint32:
            iVar1 = read_uint32_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,
                               (uint32_t *)pfStack_30);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)(uint)pfStack_30[num_elements];
            }
            break;
          case coda_native_type_int64:
            dst_00 = (int64_t *)malloc((long)dst_local << 3);
            if (dst_00 == (int64_t *)0x0) {
              coda_set_error(-1,"out of memory (could not allocate %lu bytes)",(long)dst_local << 3)
              ;
              return -1;
            }
            iVar1 = read_int64_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,dst_00);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              free(dst_00);
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)dst_00[num_elements];
            }
            free(dst_00);
            break;
          case coda_native_type_uint64:
            dst_01 = (uint64_t *)malloc((long)dst_local << 3);
            if (dst_01 == (uint64_t *)0x0) {
              coda_set_error(-1,"out of memory (could not allocate %lu bytes)",(long)dst_local << 3)
              ;
              return -1;
            }
            iVar1 = read_uint64_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,dst_01);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              free(dst_01);
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              local_8c = (float)dst_01[num_elements];
              pfStack_30[num_elements] = local_8c;
            }
            free(dst_01);
            break;
          case coda_native_type_float:
            iVar1 = read_float_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,pfStack_30);
            if (iVar1 != 0) {
              return -1;
            }
            break;
          case coda_native_type_double:
            pdVar3 = (double *)malloc((long)dst_local << 3);
            if (pdVar3 == (double *)0x0) {
              coda_set_error(-1,"out of memory (could not allocate %lu bytes)",(long)dst_local << 3)
              ;
              return -1;
            }
            iVar1 = read_double_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,pdVar3);
            num_elements = (long)dst_local;
            if (iVar1 != 0) {
              free(pdVar3);
              return -1;
            }
            while (num_elements = num_elements + -1, -1 < num_elements) {
              pfStack_30[num_elements] = (float)pdVar3[num_elements];
            }
            free(pdVar3);
            break;
          default:
            pcVar2 = coda_type_get_native_type_name(conversion._4_4_);
            coda_set_error(-0x69,"can not read %s data using a float data type",pcVar2);
            return -1;
          }
          cursor_local._4_4_ = 0;
        }
        else {
          pdVar3 = (double *)malloc((long)dst_local << 3);
          if (pdVar3 == (double *)0x0) {
            coda_set_error(-1,"out of memory (could not allocate %lu bytes)",(long)dst_local << 3);
            cursor_local._4_4_ = -1;
          }
          else {
            iVar1 = coda_cursor_read_double_partial_array
                              ((coda_cursor *)offset_local,length_local,(long)dst_local,pdVar3);
            num_elements = (long)dst_local;
            if (iVar1 == 0) {
              while (num_elements = num_elements + -1, -1 < num_elements) {
                pfStack_30[num_elements] = (float)pdVar3[num_elements];
              }
              free(pdVar3);
              cursor_local._4_4_ = 0;
            }
            else {
              free(pdVar3);
              cursor_local._4_4_ = -1;
            }
          }
        }
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      pcVar2 = coda_type_get_class_name(local_80->type_class);
      coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar2);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_float_partial_array(const coda_cursor *cursor, long offset, long length, float *dst)
{
    coda_native_type read_type;
    coda_conversion *conversion;
    coda_type *type;
    long i;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    /* check the range for offset and length */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
        {
            return -1;
        }
        if (offset < 0 || offset >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) exceeds array range [0:%ld)", offset,
                           num_elements);
            return -1;
        }
        if (offset + length > num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array offset (%ld) + length (%ld) exceeds array range "
                           "[0:%ld)", offset, length, num_elements);
            return -1;
        }
    }

    if (get_array_element_unconverted_read_type(type, &read_type, &conversion) != 0)
    {
        return -1;
    }
    if (conversion != NULL)
    {
        double *array;

        /* let the conversion be performed by coda_cursor_read_double_array() and cast the result */
        array = malloc(length * sizeof(double));
        if (array == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                           length * sizeof(double));
            return -1;
        }
        if (coda_cursor_read_double_partial_array(cursor, offset, length, array) != 0)
        {
            free(array);
            return -1;
        }
        for (i = length - 1; i >= 0; i--)
        {
            dst[i] = (float)array[i];
        }
        free(array);
        return 0;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            if (read_int8_partial_array(cursor, offset, length, (int8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int8_t *)dst)[i];
            }
            break;
        case coda_native_type_uint8:
            if (read_uint8_partial_array(cursor, offset, length, (uint8_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint8_t *)dst)[i];
            }
            break;
        case coda_native_type_int16:
            if (read_int16_partial_array(cursor, offset, length, (int16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int16_t *)dst)[i];
            }
            break;
        case coda_native_type_uint16:
            if (read_uint16_partial_array(cursor, offset, length, (uint16_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint16_t *)dst)[i];
            }
            break;
        case coda_native_type_int32:
            if (read_int32_partial_array(cursor, offset, length, (int32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((int32_t *)dst)[i];
            }
            break;
        case coda_native_type_uint32:
            if (read_uint32_partial_array(cursor, offset, length, (uint32_t *)dst) != 0)
            {
                return -1;
            }
            for (i = length - 1; i >= 0; i--)
            {
                dst[i] = (float)((uint32_t *)dst)[i];
            }
            break;
        case coda_native_type_int64:
            {
                int64_t *array;

                array = malloc(length * sizeof(int64_t));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(int64_t));
                    return -1;
                }
                if (read_int64_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        case coda_native_type_uint64:
            {
                uint64_t *array;

                array = malloc(length * sizeof(uint64_t));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(int64_t));
                    return -1;
                }
                if (read_uint64_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        case coda_native_type_float:
            if (read_float_partial_array(cursor, offset, length, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_native_type_double:
            {
                double *array;

                array = malloc(length * sizeof(double));
                if (array == NULL)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes)",
                                   length * sizeof(double));
                    return -1;
                }
                if (read_double_partial_array(cursor, offset, length, array) != 0)
                {
                    free(array);
                    return -1;
                }
                for (i = length - 1; i >= 0; i--)
                {
                    dst[i] = (float)array[i];
                }
                free(array);
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a float data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}